

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbeat_message_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::HeartbeatMessageTest_test_encode_Test::TestBody
          (HeartbeatMessageTest_test_encode_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ByteBuffer buffer;
  AssertHelper AStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  ByteBuffer local_40 [48];
  
  bidfx_public_api::price::pixie::HeartbeatMessage::HeartbeatMessage((HeartbeatMessage *)&local_70);
  bidfx_public_api::price::pixie::HeartbeatMessage::Encode((int)local_40);
  bidfx_public_api::tools::BufferUtil::BufferAsHex_abi_cxx11_((ByteBuffer *)&local_70);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_50,"\"48\"","BufferUtil::BufferAsHex(buffer)",(char (*) [3])"48",&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/heartbeat_message_test.cpp"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&AStack_78);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_40);
  return;
}

Assistant:

TEST(HeartbeatMessageTest, test_encode)
{
    ByteBuffer buffer = HeartbeatMessage().Encode(PixieVersion::CURRENT_VERSION);
    EXPECT_EQ("48", BufferUtil::BufferAsHex(buffer));
}